

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O0

MeshHeader * __thiscall
rw::Geometry::allocateMeshes(Geometry *this,int32 numMeshes,uint32 numIndices,bool32 noIndices)

{
  short sVar1;
  int local_40;
  uint local_3c;
  int32 i;
  int32 oldNumMeshes;
  uint16 *indices;
  Mesh *m;
  MeshHeader *mh;
  uint32 sz;
  bool32 noIndices_local;
  uint32 numIndices_local;
  int32 numMeshes_local;
  Geometry *this_local;
  
  mh._0_4_ = numMeshes * 0x18 + 0x10;
  if (noIndices == 0) {
    mh._0_4_ = (uint)mh + numIndices * 2;
  }
  if (this->meshHeader == (MeshHeader *)0x0) {
    local_3c = 0;
    m = (Mesh *)mustmalloc_LOC((ulong)(uint)mh,0x3000f,
                               "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geoplg.cpp line: 50"
                              );
    *(uint32 *)&m->indices = 0;
    this->meshHeader = (MeshHeader *)m;
  }
  else {
    local_3c = (uint)this->meshHeader->numMeshes;
    m = (Mesh *)mustrealloc_LOC(this->meshHeader,(ulong)(uint)mh,0x3000f,
                                "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geoplg.cpp line: 46"
                               );
    this->meshHeader = (MeshHeader *)m;
  }
  *(short *)((long)&m->indices + 4) = (short)numMeshes;
  sVar1 = nextSerialNum + 1;
  *(short *)((long)&m->indices + 6) = nextSerialNum;
  nextSerialNum = sVar1;
  m->numIndices = numIndices;
  indices = (uint16 *)MeshHeader::getMeshes((MeshHeader *)m);
  _i = (Mesh *)((long)indices + (long)numMeshes * 0x18);
  for (local_40 = 0; local_40 < (int)(uint)*(ushort *)((long)&m->indices + 4);
      local_40 = local_40 + 1) {
    if ((int)local_3c <= local_40) {
      indices[8] = 0;
      indices[9] = 0;
      indices[10] = 0;
      indices[0xb] = 0;
      indices[4] = 0;
      indices[5] = 0;
    }
    if (noIndices == 0) {
      *(Mesh **)indices = _i;
      _i = (Mesh *)((long)&_i->indices + (ulong)*(uint *)(indices + 4) * 2);
    }
    else {
      indices[0] = 0;
      indices[1] = 0;
      indices[2] = 0;
      indices[3] = 0;
    }
    indices = indices + 0xc;
  }
  return (MeshHeader *)m;
}

Assistant:

MeshHeader*
Geometry::allocateMeshes(int32 numMeshes, uint32 numIndices, bool32 noIndices)
{
	uint32 sz;
	MeshHeader *mh;
	Mesh *m;
	uint16 *indices;
	int32 oldNumMeshes;
	int32 i;
	sz = sizeof(MeshHeader) + numMeshes*sizeof(Mesh);
	if(!noIndices)
		sz += numIndices*sizeof(uint16);
	if(this->meshHeader){
		oldNumMeshes = this->meshHeader->numMeshes;
		mh = (MeshHeader*)rwResize(this->meshHeader, sz, MEMDUR_EVENT | ID_GEOMETRY);
		this->meshHeader = mh;
	}else{
		oldNumMeshes = 0;
		mh = (MeshHeader*)rwNew(sz, MEMDUR_EVENT | ID_GEOMETRY);
		mh->flags = 0;
		this->meshHeader = mh;
	}
	mh->numMeshes = numMeshes;
	mh->serialNum = nextSerialNum++;
	mh->totalIndices = numIndices;
	m = mh->getMeshes();
	indices = (uint16*)&m[numMeshes];
	for(i = 0; i < mh->numMeshes; i++){
		// keep these
		if(i >= oldNumMeshes){
			m->material = nil;
			m->numIndices = 0;
		}
		// always init indices
		if(noIndices)
			m->indices = nil;
		else{
			m->indices = indices;
			indices += m->numIndices;
		}
		m++;
	}
	return mh;
}